

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

int diy::io::utils::truncate(char *__file,__off_t __length)

{
  char *__file_00;
  int iVar1;
  int error;
  
  __file_00 = (char *)std::__cxx11::string::c_str();
  iVar1 = ::truncate(__file_00,__length);
  return iVar1;
}

Assistant:

inline void truncate(const std::string& filename, size_t length)
  {
#if defined(_WIN32)
    int fd = -1;
    _sopen_s(&fd, filename.c_str(), _O_WRONLY | _O_BINARY, _SH_DENYNO, _S_IWRITE);
    if (fd != -1)
    {
      _chsize_s(fd, static_cast<__int64>(length));
      _close(fd);
    }
#else
    int error = ::truncate(filename.c_str(), static_cast<off_t>(length));
    DIY_UNUSED(error);
#endif
  }